

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O3

void __thiscall
TMap<int,_FUDMFKeys,_THashTraits<int>,_TValueTraits<FUDMFKeys>_>::Resize
          (TMap<int,_FUDMFKeys,_THashTraits<int>,_TValueTraits<FUDMFKeys>_> *this,hash_t nhsize)

{
  Node *block;
  Node *pNVar1;
  ulong uVar2;
  TArray<FUDMFKey,_FUDMFKey> *other;
  
  uVar2 = (ulong)this->Size;
  block = this->Nodes;
  SetNodeVector(this,nhsize);
  this->NumUsed = 0;
  if (uVar2 != 0) {
    other = &(block->Pair).Value.super_TArray<FUDMFKey,_FUDMFKey>;
    do {
      if (other[-1].Array != (FUDMFKey *)0x1) {
        pNVar1 = NewKey(this,other[-1].Most);
        TArray<FUDMFKey,_FUDMFKey>::DoCopy
                  (&(pNVar1->Pair).Value.super_TArray<FUDMFKey,_FUDMFKey>,other);
        TArray<FUDMFKey,_FUDMFKey>::~TArray(other);
      }
      other = other + 2;
      uVar2 = uVar2 - 1;
    } while (uVar2 != 0);
  }
  M_Free(block);
  return;
}

Assistant:

void Resize(hash_t nhsize)
	{
		hash_t i, oldhsize = Size;
		Node *nold = Nodes;
		/* create new hash part with appropriate size */
		SetNodeVector(nhsize);
		/* re-insert elements from hash part */
		NumUsed = 0;
		for (i = 0; i < oldhsize; ++i)
		{
			if (!nold[i].IsNil())
			{
				Node *n = NewKey(nold[i].Pair.Key);
				::new(&n->Pair.Value) VT(nold[i].Pair.Value);
				nold[i].~Node();
			}
		}
		M_Free(nold);
	}